

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
          (bin_writer<3> *this,counting_iterator<char> *it)

{
  size_t *in_RSI;
  undefined8 in_RDI;
  counting_iterator<char> cVar1;
  unsigned_long unaff_retaddr;
  counting_iterator<char> in_stack_00000008;
  
  cVar1 = internal::format_uint<3u,char,fmt::v5::internal::counting_iterator<char>,unsigned_long>
                    (in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                     SUB81((ulong)in_RDI >> 0x18,0));
  *in_RSI = cVar1.count_;
  *(char *)(in_RSI + 1) = cVar1.blackhole_;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }